

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O2

void caffe::ReadSolverParamsFromTextFileOrDie(string *param_file,SolverParameter *param)

{
  string *this;
  string local_30;
  
  this = &local_30;
  std::__cxx11::string::string((string *)this,(string *)param_file);
  std::__cxx11::string::~string((string *)this);
  UpgradeSolverAsNeeded(this,param);
  return;
}

Assistant:

void ReadSolverParamsFromTextFileOrDie(const string& param_file,
                                       SolverParameter* param) {
  CHECK(ReadProtoFromTextFile(param_file, param))
      << "Failed to parse SolverParameter file: " << param_file;
  UpgradeSolverAsNeeded(param_file, param);
}